

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Drive.cpp
# Opt level: O0

void __thiscall Storage::Disk::Drive::end_writing(Drive *this)

{
  bool bVar1;
  element_type *original;
  PCMTrack *__p;
  element_type *peVar2;
  Track *tr;
  undefined8 local_18;
  size_t high_resolution_track_rate;
  Drive *this_local;
  
  local_18 = 3200000;
  if ((this->is_reading_ & 1U) != 0) {
    return;
  }
  this->is_reading_ = true;
  high_resolution_track_rate = (size_t)this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->patched_track_);
  if (!bVar1) {
    std::dynamic_pointer_cast<Storage::Disk::PCMTrack,Storage::Disk::Track>
              ((shared_ptr<Storage::Disk::Track> *)&tr);
    std::shared_ptr<Storage::Disk::PCMTrack>::operator=
              (&this->patched_track_,(shared_ptr<Storage::Disk::PCMTrack> *)&tr);
    std::shared_ptr<Storage::Disk::PCMTrack>::~shared_ptr
              ((shared_ptr<Storage::Disk::PCMTrack> *)&tr);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->patched_track_);
    if (bVar1) {
      peVar2 = std::
               __shared_ptr_access<Storage::Disk::PCMTrack,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Storage::Disk::PCMTrack,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->patched_track_);
      bVar1 = PCMTrack::is_resampled_clone(peVar2);
      if (bVar1) goto LAB_00982db6;
    }
    original = std::__shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>::get
                         (&(this->track_).
                           super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>);
    __p = PCMTrack::resampled_clone(original,3200000);
    std::__shared_ptr<Storage::Disk::PCMTrack,_(__gnu_cxx::_Lock_policy)2>::
    reset<Storage::Disk::PCMTrack>
              (&(this->patched_track_).
                super___shared_ptr<Storage::Disk::PCMTrack,_(__gnu_cxx::_Lock_policy)2>,__p);
  }
LAB_00982db6:
  peVar2 = std::
           __shared_ptr_access<Storage::Disk::PCMTrack,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Storage::Disk::PCMTrack,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->patched_track_);
  PCMTrack::add_segment
            (peVar2,&this->write_start_time_,&this->write_segment_,
             (bool)(this->clamp_writing_to_index_hole_ & 1));
  this->cycles_since_index_hole_ =
       this->cycles_since_index_hole_ % (long)this->cycles_per_revolution_;
  invalidate_track(this);
  return;
}

Assistant:

void Drive::end_writing() {
	// If the user modifies a track, it's scaled up to a "high" resolution and modifications
	// are plotted on top of that.
	//
	// "High" is defined as: two samples per clock relative to an idiomatic
	// 8Mhz disk controller and 300RPM disk speed.
	const size_t high_resolution_track_rate = 3200000;

	if(!is_reading_) {
		is_reading_ = true;

		if(!patched_track_) {
			// Avoid creating a new patched track if this one is already patched
			patched_track_ = std::dynamic_pointer_cast<PCMTrack>(track_);
			if(!patched_track_ || !patched_track_->is_resampled_clone()) {
				Track *const tr = track_.get();
				patched_track_.reset(PCMTrack::resampled_clone(tr, high_resolution_track_rate));
			}
		}
		patched_track_->add_segment(write_start_time_, write_segment_, clamp_writing_to_index_hole_);
		cycles_since_index_hole_ %= cycles_per_revolution_;
		invalidate_track();
	}
}